

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O1

LY_ERR yin_parse_argument(lysp_yin_ctx *ctx,void *parent,yin_argument_meta *arg_meta,
                         lysp_ext_instance **exts)

{
  LY_ERR LVar1;
  yin_subelement subelems [2];
  yin_subelement local_58;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  
  local_58.type = LY_STMT_YIN_ELEMENT;
  local_58.dest = arg_meta->flags;
  local_58.flags = 2;
  uStack_38 = 0;
  local_30 = 0;
  local_40 = 0xf0000;
  LVar1 = lyxml_ctx_next(ctx->xmlctx);
  if ((LVar1 == LY_SUCCESS) &&
     (LVar1 = yin_parse_attribute(ctx,YIN_ARG_NAME,arg_meta->argument,Y_IDENTIF_ARG,LY_STMT_ARGUMENT
                                 ), LVar1 == LY_SUCCESS)) {
    LVar1 = yin_parse_content(ctx,&local_58,2,parent,LY_STMT_ARGUMENT,(char **)0x0,exts);
  }
  return LVar1;
}

Assistant:

static LY_ERR
yin_parse_argument(struct lysp_yin_ctx *ctx, const void *parent, struct yin_argument_meta *arg_meta, struct lysp_ext_instance **exts)
{
    struct yin_subelement subelems[] = {
        {LY_STMT_YIN_ELEMENT, arg_meta->flags, YIN_SUBELEM_UNIQUE},
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0}
    };

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_NAME, arg_meta->argument, Y_IDENTIF_ARG, LY_STMT_ARGUMENT));

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), parent, LY_STMT_ARGUMENT, NULL, exts));

    return LY_SUCCESS;
}